

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::Transpose(Matrix *this)

{
  uint cols;
  uint rows;
  int iVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  long *in_RSI;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Matrix MVar10;
  
  cols = *(uint *)(in_RSI + 1);
  rows = *(uint *)((long)in_RSI + 0xc);
  Matrix(this,rows,cols);
  pdVar3 = this->data;
  iVar1 = this->cols;
  uVar4 = 0;
  uVar9 = (ulong)cols;
  if ((int)cols < 1) {
    uVar9 = uVar4;
  }
  uVar8 = (ulong)rows;
  if ((int)rows < 1) {
    uVar8 = uVar4;
  }
  for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    iVar2 = *(int *)((long)in_RSI + 0xc);
    pdVar6 = (double *)(*in_RSI + uVar4);
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      pdVar3[uVar7] = *pdVar6;
      pdVar6 = pdVar6 + iVar2;
    }
    pdVar3 = pdVar3 + iVar1;
    uVar4 = uVar4 + 8;
  }
  MVar10.rows = (int)uVar4;
  MVar10.cols = (int)(uVar4 >> 0x20);
  MVar10.data = (double *)this;
  return MVar10;
}

Assistant:

Matrix Matrix::Transpose() const
{
    int m = GetRows();
    int n = GetCols();
    Matrix T(n, m);
    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < m; j++)
        {
            T(i, j) = this->operator()(j, i);
        }
    }
    return T;
}